

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall
Widget_Browser::item_draw(Widget_Browser *this,void *v,int X,int Y,int param_4,int param_5)

{
  int x;
  int iVar1;
  Fl_Fontsize FVar2;
  int iVar3;
  Fl_Color FVar4;
  Fl_Font FVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  undefined4 extraout_var;
  bool bVar9;
  double dVar10;
  double dVar11;
  char *local_1a8;
  char *c;
  Fl_Pixmap *pm;
  int comment_incr;
  int w1;
  int x1;
  char buf [340];
  Fl_Type *l;
  int param_5_local;
  int param_4_local;
  int Y_local;
  int X_local;
  void *v_local;
  Widget_Browser *this_local;
  
  x = *(int *)((long)v + 0x48) * 0xc + 0x22 + X;
  unique0x100005e5 = (Fl_Type *)v;
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  pm._4_4_ = 0;
  param_5_local = Y;
  if ((show_comments != 0) &&
     (pcVar8 = Fl_Type::comment(stack0xffffffffffffffd0), pcVar8 != (char *)0x0)) {
    pcVar8 = Fl_Type::comment(stack0xffffffffffffffd0);
    copy_trunc((char *)&w1,pcVar8,0x50,0);
    FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    iVar3 = FVar2 + -1;
    if (stack0xffffffffffffffd0->new_selected == '\0') {
      FVar4 = Fl_Widget::color((Fl_Widget *)this);
      FVar4 = fl_contrast(0x3c,FVar4);
      fl_color(FVar4);
    }
    else {
      FVar4 = fl_contrast(0x3c,0xf);
      fl_color(FVar4);
    }
    FVar5 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
    FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    fl_font(FVar5 + 2,FVar2 + -2);
    fl_draw((char *)&w1,x,Y + 0xc);
    param_5_local = iVar3 / 2 + Y;
    pm._4_4_ = iVar3 - iVar3 / 2;
  }
  if (stack0xffffffffffffffd0->new_selected == '\0') {
    fl_color(0);
  }
  else {
    FVar4 = fl_contrast(0,0xf);
    fl_color(FVar4);
  }
  iVar3 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[0x16])();
  if (iVar3 != 0) {
    if ((stack0xffffffffffffffd0->next == (Fl_Type *)0x0) ||
       (stack0xffffffffffffffd0->next->level <= stack0xffffffffffffffd0->level)) {
      if ((int)stack0xffffffffffffffd0->open_ == (uint)(stack0xffffffffffffffd0 == pushedtitle)) {
        fl_loop(x + -0x1d,param_5_local + 2,x + -0x18,param_5_local + 7,x + -0x1d,
                param_5_local + 0xc);
      }
      else {
        fl_loop(x + -0x1f,param_5_local + 7,x + -0x1a,param_5_local + 0xc,x + -0x15,
                param_5_local + 7);
      }
    }
    else if ((int)stack0xffffffffffffffd0->open_ == (uint)(stack0xffffffffffffffd0 == pushedtitle))
    {
      fl_polygon(x + -0x1d,param_5_local + 2,x + -0x18,param_5_local + 7,x + -0x1d,
                 param_5_local + 0xc);
    }
    else {
      fl_polygon(x + -0x1f,param_5_local + 7,x + -0x1a,param_5_local + 0xc,x + -0x15,
                 param_5_local + 7);
    }
  }
  iVar3 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[0x28])();
  if (pixmap[iVar3] != (Fl_Pixmap *)0x0) {
    Fl_Pixmap::draw(pixmap[iVar3],x + -0x12,param_5_local);
  }
  iVar3 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[0x27])();
  if (iVar3 == 0) {
    Fl_Pixmap::draw(&lock_pixmap,x + -0x11,param_5_local);
  }
  else if (iVar3 == 2) {
    Fl_Pixmap::draw(&protected_pixmap,x + -0x11,param_5_local);
  }
  iVar3 = pm._4_4_ + param_5_local;
  iVar6 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[0x17])();
  if ((iVar6 == 0) && (iVar6 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[0x26])(), iVar6 == 0)) {
    iVar6 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[4])();
    copy_trunc((char *)&w1,(char *)CONCAT44(extraout_var,iVar6),0x37,0);
    uVar7 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
    iVar6 = (*stack0xffffffffffffffd0->_vptr_Fl_Type[0x23])();
    bVar9 = false;
    if ((iVar6 != 0) && (bVar9 = true, stack0xffffffffffffffd0->level != 0)) {
      iVar6 = (*stack0xffffffffffffffd0->parent->_vptr_Fl_Type[0x26])();
      bVar9 = iVar6 != 0;
    }
    FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    fl_font(uVar7 | !bVar9,FVar2);
    fl_draw((char *)&w1,x,iVar3 + 0xd);
  }
  else {
    local_1a8 = subclassname(stack0xffffffffffffffd0);
    iVar6 = strncmp(local_1a8,"Fl_",3);
    if (iVar6 == 0) {
      local_1a8 = local_1a8 + 3;
    }
    FVar5 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
    FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    fl_font(FVar5,FVar2);
    fl_draw(local_1a8,x,iVar3 + 0xd);
    dVar10 = fl_width(local_1a8);
    dVar11 = fl_width(0x6e);
    iVar6 = (int)(dVar10 + dVar11) + x;
    pcVar8 = Fl_Type::name(stack0xffffffffffffffd0);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = Fl_Type::label(stack0xffffffffffffffd0);
      if (pcVar8 != (char *)0x0) {
        copy_trunc((char *)&w1,pcVar8,0x14,1);
        fl_draw((char *)&w1,iVar6,iVar3 + 0xd);
      }
    }
    else {
      uVar7 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
      FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
      fl_font(uVar7 | 1,FVar2);
      fl_draw(pcVar8,iVar6,iVar3 + 0xd);
    }
  }
  if (stack0xffffffffffffffd0->new_selected == '\0') {
    FVar4 = fl_lighter(0x31);
    fl_color(FVar4);
    fl_line(x,iVar3 + 0x10,x + (iVar1 - x),iVar3 + 0x10);
  }
  return;
}

Assistant:

void Widget_Browser::item_draw(void *v, int X, int Y, int, int) const {
  // cast to a more general type
  Fl_Type *l = (Fl_Type *)v;

  char buf[340]; // edit buffer: large enough to hold 80 UTF-8 chars + nul

  // calculate the horizontal start position of this item
  // 3 is the edge of the browser
  // 13 is the width of the arrow that indicates children for the item
  // 18 is the width of the icon
  // 12 is the indent per level
  X += 3 + 13 + 18 + l->level * 12;

  // calculate the horizontal start position and width of the separator line
  int x1 = X;
  int w1 = w() - x1;

  // items can contain a comment. If they do, the comment gets a second text
  // line inside this browser line
  int comment_incr = 0;
  if (show_comments && l->comment()) {
    copy_trunc(buf, l->comment(), 80, 0);
    comment_incr = textsize()-1;
    if (l->new_selected) fl_color(fl_contrast(FL_DARK_GREEN,FL_SELECTION_COLOR));
    else fl_color(fl_contrast(FL_DARK_GREEN,color()));
    fl_font(textfont()+FL_ITALIC, textsize()-2);
    fl_draw(buf, X, Y+12);
    Y += comment_incr/2;
    comment_incr -= comment_incr/2;
  }
  
  if (l->new_selected) fl_color(fl_contrast(FL_FOREGROUND_COLOR,FL_SELECTION_COLOR));
  else fl_color(FL_FOREGROUND_COLOR);
  
  // Width=10: Draw the triangle that indicates possible children
  if (l->is_parent()) {
    X = X - 18 - 13;
    if (!l->next || l->next->level <= l->level) {
      if (l->open_!=(l==pushedtitle)) {
        // an outlined triangle to the right indicates closed item, no children
        fl_loop(X,Y+7,X+5,Y+12,X+10,Y+7);
      } else {
        // an outlined triangle to the bottom indicates open item, no children
        fl_loop(X+2,Y+2,X+7,Y+7,X+2,Y+12);
      }
    } else {
      if (l->open_!=(l==pushedtitle)) {
        // a filled triangle to the right indicates closed item, with children
        fl_polygon(X,Y+7,X+5,Y+12,X+10,Y+7);
      } else {
        // a filled triangle to the bottom indicates open item, with children
        fl_polygon(X+2,Y+2,X+7,Y+7,X+2,Y+12);
      }
    }
    X = X + 13 + 18;
  }
  
  // Width=18: Draw the icon associated with the type.
  Fl_Pixmap *pm = pixmap[l->pixmapID()];
  if (pm) pm->draw(X-18, Y);
  
  // Add tags on top of the icon for locked and protected types.
  switch (l->is_public()) {
    case 0: lock_pixmap.draw(X - 17, Y); break;
    case 2: protected_pixmap.draw(X - 17, Y); break;
  }
  
  // Indent=12 per level: Now write the text that comes after the graphics representation
  Y += comment_incr;
  if (l->is_widget() || l->is_class()) {
    const char* c = subclassname(l);
    if (!strncmp(c,"Fl_",3)) c += 3;
    fl_font(textfont(), textsize());
    fl_draw(c, X, Y+13);
    X += int(fl_width(c)+fl_width('n'));
    c = l->name();
    if (c) {
      fl_font(textfont()|FL_BOLD, textsize());
      fl_draw(c, X, Y+13);
    } else if ((c = l->label())) {
      copy_trunc(buf, c, 20, 1); // quoted string
      fl_draw(buf, X, Y+13);
    }
  } else {
    copy_trunc(buf, l->title(), 55, 0);
    fl_font(textfont() | (l->is_code_block() && (l->level==0 || l->parent->is_class())?0:FL_BOLD), textsize());
    fl_draw(buf, X, Y+13);
  }

  // draw a thin line below the item if this item is not selected
  // (if it is selected this additional line would look bad)
  if (!l->new_selected) {
    fl_color(fl_lighter(FL_GRAY));
    fl_line(x1,Y+16,x1+w1,Y+16);
  }
}